

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen_c.hpp
# Opt level: O0

void CodegenC::codegen(Program *program,char *source_path,TailCallData *tail_call_data)

{
  anon_class_40_5_fb25ca9c_for_f f;
  anon_class_40_5_fb25ca9c_for_f f_00;
  Type result_00;
  bool bVar1;
  int iVar2;
  Function *function_00;
  Type *pTVar3;
  vector<const_Type_*,_std::allocator<const_Type_*>_> *this;
  size_t variable;
  Block *block;
  char *pcVar4;
  undefined4 in_stack_fffffffffffff220;
  undefined4 in_stack_fffffffffffff224;
  PrintTuple<char[6],_char[24],_char[6]> local_cf0;
  PrintTuple<char[5],_PrintTuple<char[6],_char[24],_char[6]>,_char[6]> local_cd0;
  PrintTuple<char[5],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[6]>
  local_cb0;
  allocator<char> local_c89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_be8;
  undefined1 local_bc8 [8];
  string command;
  char *compiler_arguments;
  char *c_compiler;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b90;
  undefined1 local_b70 [8];
  string executable_path;
  PrintTuple<char[5],_PrintTuple<char[6],_char[24],_char[6]>,_char[6]> local_b30;
  PrintTuple<char[5],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[6]>
  local_b10;
  Printer local_af0;
  Printer status_printer;
  string local_ac8 [32];
  string local_aa8 [32];
  string local_a88 [32];
  ostream local_a68 [8];
  ofstream file;
  allocator<char> local_861;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_860;
  undefined1 local_840 [8];
  string c_path;
  Format<CodegenC::Type,_Variable> local_800;
  Type local_7e0;
  Type result_type;
  Variable result;
  PrintFunctor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_eyelash[P]moebius_codegen_c_hpp:1005:45)>
  local_7a8;
  size_t *local_780;
  size_t *psStack_778;
  size_type *local_770;
  Type *pTStack_768;
  size_t *local_760;
  PrintFunctor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_eyelash[P]moebius_codegen_c_hpp:992:55)>
  local_758;
  size_type local_730;
  size_t arguments;
  size_t index_1;
  Type return_type;
  Function *function;
  Iterator __end1;
  Iterator __begin1;
  Program *__range1;
  Format<PrintNumber> local_6f0;
  size_t local_6d8;
  size_t index;
  FunctionTable function_table;
  IndentPrinter printer;
  IndentPrinter type_function_printer;
  IndentPrinter function_declaration_printer;
  IndentPrinter type_declaration_printer;
  ostringstream functions;
  ostringstream local_498 [8];
  ostringstream type_functions;
  ostringstream local_310 [8];
  ostringstream function_declarations;
  ostringstream local_198 [8];
  ostringstream type_declarations;
  TailCallData *tail_call_data_local;
  char *source_path_local;
  Program *program_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::__cxx11::ostringstream::ostringstream(local_310);
  std::__cxx11::ostringstream::ostringstream(local_498);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&type_declaration_printer.indentation)
  ;
  IndentPrinter::IndentPrinter
            ((IndentPrinter *)&function_declaration_printer.indentation,(ostream *)local_198);
  IndentPrinter::IndentPrinter
            ((IndentPrinter *)&type_function_printer.indentation,(ostream *)local_310);
  IndentPrinter::IndentPrinter((IndentPrinter *)&printer.indentation,(ostream *)local_498);
  IndentPrinter::IndentPrinter
            ((IndentPrinter *)&function_table.type_function_printer,
             (ostream *)&type_declaration_printer.indentation);
  FunctionTable::FunctionTable
            ((FunctionTable *)&index,(IndentPrinter *)&function_declaration_printer.indentation,
             (IndentPrinter *)&type_function_printer.indentation,
             (IndentPrinter *)&printer.indentation);
  IndentPrinter::println<char[20]>
            ((IndentPrinter *)&function_declaration_printer.indentation,
             (char (*) [20])"#include <stdlib.h>");
  IndentPrinter::println<char[20]>
            ((IndentPrinter *)&function_declaration_printer.indentation,
             (char (*) [20])"#include <stdint.h>");
  IndentPrinter::println<char[19]>
            ((IndentPrinter *)&function_declaration_printer.indentation,
             (char (*) [19])"#include <stdio.h>");
  IndentPrinter::println_increasing<char[34]>
            ((IndentPrinter *)&function_table.type_function_printer,
             (char (*) [34])"int main(int argc, char **argv) {");
  function_00 = Program::get_main_function(program);
  local_6d8 = FunctionTable::look_up((FunctionTable *)&index,function_00);
  __range1._4_4_ = print_number((uint)local_6d8);
  format<PrintNumber>(&local_6f0,"f%();",(PrintNumber *)((long)&__range1 + 4));
  IndentPrinter::println<Format<PrintNumber>>
            ((IndentPrinter *)&function_table.type_function_printer,&local_6f0);
  IndentPrinter::println<char[10]>
            ((IndentPrinter *)&function_table.type_function_printer,(char (*) [10])"return 0;");
  IndentPrinter::println_decreasing<char[2]>
            ((IndentPrinter *)&function_table.type_function_printer,(char (*) [2])0x1808d6);
  __end1 = Program::begin(program);
  function = (Function *)Program::end(program);
  while (bVar1 = Program::Iterator::operator!=(&__end1,(Iterator *)&function), bVar1) {
    return_type.index = (size_t)Program::Iterator::operator*(&__end1);
    pTVar3 = Function::get_return_type((Function *)return_type.index);
    index_1 = (size_t)FunctionTable::get_type((FunctionTable *)&index,pTVar3);
    arguments = FunctionTable::look_up((FunctionTable *)&index,return_type.index);
    this = Function::get_argument_types((Function *)return_type.index);
    local_730 = std::vector<const_Type_*,_std::allocator<const_Type_*>_>::size(this);
    local_780 = &index_1;
    psStack_778 = &arguments;
    local_770 = &local_730;
    pTStack_768 = &return_type;
    local_760 = &index;
    f.index = local_770;
    f.return_type = (Type *)psStack_778;
    f.arguments = &pTStack_768->index;
    f.function = (Function **)local_760;
    f.function_table._0_4_ = in_stack_fffffffffffff220;
    f.function_table._4_4_ = in_stack_fffffffffffff224;
    print_functor<CodegenC::codegen(Program_const&,char_const*,TailCallData_const&)::_lambda(auto:1&)_1_>
              (f);
    IndentPrinter::
    println<PrintFunctor<CodegenC::codegen(Program_const&,char_const*,TailCallData_const&)::_lambda(auto:1&)_1_>>
              ((IndentPrinter *)&type_function_printer.indentation,&local_758);
    f_00.index = &local_730;
    f_00.return_type = (Type *)&arguments;
    f_00.arguments = &return_type.index;
    f_00.function = (Function **)&index;
    f_00.function_table._0_4_ = in_stack_fffffffffffff220;
    f_00.function_table._4_4_ = in_stack_fffffffffffff224;
    print_functor<CodegenC::codegen(Program_const&,char_const*,TailCallData_const&)::_lambda(auto:1&)_2_>
              (f_00);
    IndentPrinter::
    println_increasing<PrintFunctor<CodegenC::codegen(Program_const&,char_const*,TailCallData_const&)::_lambda(auto:1&)_2_>>
              ((IndentPrinter *)&function_table.type_function_printer,&local_7a8);
    bVar1 = TailCallData::has_tail_call(tail_call_data,(Function *)return_type.index);
    if (bVar1) {
      IndentPrinter::println_increasing<char[12]>
                ((IndentPrinter *)&function_table.type_function_printer,(char (*) [12])"while (1) {"
                );
    }
    Variable::Variable((Variable *)&result_type,local_730);
    pTVar3 = Function::get_return_type((Function *)return_type.index);
    iVar2 = (*pTVar3->_vptr_Type[2])();
    if (iVar2 != 9) {
      pTVar3 = Function::get_return_type((Function *)return_type.index);
      local_7e0 = FunctionTable::get_type((FunctionTable *)&index,pTVar3);
      format<CodegenC::Type,Variable>(&local_800,"% %;",&local_7e0,(Variable *)&result_type);
      IndentPrinter::println<Format<CodegenC::Type,Variable>>
                ((IndentPrinter *)&function_table.type_function_printer,&local_800);
    }
    result_00.index = result_type.index;
    variable = local_730 + 1;
    block = Function::get_block((Function *)return_type.index);
    evaluate((FunctionTable *)&index,(IndentPrinter *)&function_table.type_function_printer,variable
             ,(Variable)result_00.index,tail_call_data,block);
    pTVar3 = Function::get_return_type((Function *)return_type.index);
    iVar2 = (*pTVar3->_vptr_Type[2])();
    if (iVar2 == 9) {
      IndentPrinter::println<char[8]>
                ((IndentPrinter *)&function_table.type_function_printer,(char (*) [8])"return;");
    }
    else {
      format<Variable>((Format<Variable> *)((long)&c_path.field_2 + 8),"return %;",
                       (Variable *)&result_type);
      IndentPrinter::println<Format<Variable>>
                ((IndentPrinter *)&function_table.type_function_printer,
                 (Format<Variable> *)((long)&c_path.field_2 + 8));
    }
    bVar1 = TailCallData::has_tail_call(tail_call_data,(Function *)return_type.index);
    if (bVar1) {
      IndentPrinter::println_decreasing<char[2]>
                ((IndentPrinter *)&function_table.type_function_printer,(char (*) [2])0x1808d6);
    }
    IndentPrinter::println_decreasing<char[2]>
              ((IndentPrinter *)&function_table.type_function_printer,(char (*) [2])0x1808d6);
    Program::Iterator::operator++(&__end1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_860,source_path,&local_861);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_840,
                 &local_860,".c");
  std::__cxx11::string::~string((string *)&local_860);
  std::allocator<char>::~allocator(&local_861);
  std::ofstream::ofstream(local_a68,local_840,0x10);
  std::__cxx11::ostringstream::str();
  std::operator<<(local_a68,local_a88);
  std::__cxx11::string::~string(local_a88);
  std::__cxx11::ostringstream::str();
  std::operator<<(local_a68,local_aa8);
  std::__cxx11::string::~string(local_aa8);
  std::__cxx11::ostringstream::str();
  std::operator<<(local_a68,local_ac8);
  std::__cxx11::string::~string(local_ac8);
  std::__cxx11::ostringstream::str();
  std::operator<<(local_a68,(string *)&status_printer);
  std::__cxx11::string::~string((string *)&status_printer);
  std::ofstream::~ofstream(local_a68);
  Printer::Printer(&local_af0,(ostream *)&std::cerr);
  $_0::operator()(&local_b10,(__0 *)&bold,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_840);
  Printer::print<PrintTuple<char[5],std::__cxx11::string,char[6]>>(&local_af0,&local_b10);
  $_1::operator()((PrintTuple<char[6],_char[24],_char[6]> *)((long)&executable_path.field_2 + 8),
                  (__1 *)&green,(char (*) [24])" successfully generated");
  $_0::operator()(&local_b30,(__0 *)&bold,
                  (PrintTuple<char[6],_char[24],_char[6]> *)((long)&executable_path.field_2 + 8));
  Printer::print<PrintTuple<char[5],PrintTuple<char[6],char[24],char[6]>,char[6]>>
            (&local_af0,&local_b30);
  Printer::print(&local_af0,'\n');
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b90,source_path,(allocator<char> *)((long)&c_compiler + 7));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b70,
                 &local_b90,".exe");
  std::__cxx11::string::~string((string *)&local_b90);
  std::allocator<char>::~allocator((allocator<char> *)((long)&c_compiler + 7));
  pcVar4 = getenv((CodegenC *)"CC","cc");
  command.field_2._8_8_ = getenv((CodegenC *)"CFLAGS","");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c88,pcVar4,&local_c89);
  std::operator+(&local_c68,&local_c88," ");
  std::operator+(&local_c48,&local_c68,(char *)command.field_2._8_8_);
  std::operator+(&local_c28,&local_c48," -o ");
  std::operator+(&local_c08,&local_c28,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b70);
  std::operator+(&local_be8,&local_c08," ");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_bc8,
                 &local_be8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_840);
  std::__cxx11::string::~string((string *)&local_be8);
  std::__cxx11::string::~string((string *)&local_c08);
  std::__cxx11::string::~string((string *)&local_c28);
  std::__cxx11::string::~string((string *)&local_c48);
  std::__cxx11::string::~string((string *)&local_c68);
  std::__cxx11::string::~string((string *)&local_c88);
  std::allocator<char>::~allocator(&local_c89);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  iVar2 = system(pcVar4);
  if (iVar2 == 0) {
    $_0::operator()(&local_cb0,(__0 *)&bold,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b70);
    Printer::print<PrintTuple<char[5],std::__cxx11::string,char[6]>>(&local_af0,&local_cb0);
    $_1::operator()(&local_cf0,(__1 *)&green,(char (*) [24])" successfully generated");
    $_0::operator()(&local_cd0,(__0 *)&bold,&local_cf0);
    Printer::print<PrintTuple<char[5],PrintTuple<char[6],char[24],char[6]>,char[6]>>
              (&local_af0,&local_cd0);
    Printer::print(&local_af0,'\n');
  }
  std::__cxx11::string::~string((string *)local_bc8);
  std::__cxx11::string::~string((string *)local_b70);
  std::__cxx11::string::~string((string *)local_840);
  FunctionTable::~FunctionTable((FunctionTable *)&index);
  std::__cxx11::ostringstream::~ostringstream
            ((ostringstream *)&type_declaration_printer.indentation);
  std::__cxx11::ostringstream::~ostringstream(local_498);
  std::__cxx11::ostringstream::~ostringstream(local_310);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return;
}

Assistant:

static void codegen(const Program& program, const char* source_path, const TailCallData& tail_call_data) {
		std::ostringstream type_declarations;
		std::ostringstream function_declarations;
		std::ostringstream type_functions;
		std::ostringstream functions;
		IndentPrinter type_declaration_printer(type_declarations);
		IndentPrinter function_declaration_printer(function_declarations);
		IndentPrinter type_function_printer(type_functions);
		IndentPrinter printer(functions);
		FunctionTable function_table(type_declaration_printer, function_declaration_printer, type_function_printer);
		type_declaration_printer.println("#include <stdlib.h>");
		type_declaration_printer.println("#include <stdint.h>");
		type_declaration_printer.println("#include <stdio.h>");
		{
			printer.println_increasing("int main(int argc, char **argv) {");
			const std::size_t index = function_table.look_up(program.get_main_function());
			printer.println(format("f%();", print_number(index)));
			printer.println("return 0;");
			printer.println_decreasing("}");
		}
		for (const Function* function: program) {
			const Type return_type = function_table.get_type(function->get_return_type());
			const std::size_t index = function_table.look_up(function);
			const std::size_t arguments = function->get_argument_types().size();
			function_declaration_printer.println(print_functor([&](auto& printer) {
				printer.print(format("static % f%(", return_type, print_number(index)));
				bool is_first_argument = true;
				for (std::size_t i = 0; i < arguments; ++i) {
					if (function->get_argument_types()[i] != TypeInterner::get_void_type()) {
						if (is_first_argument) is_first_argument = false;
						else printer.print(", ");
						const Type argument_type = function_table.get_type(function->get_argument_types()[i]);
						printer.print(format("% %", argument_type, Variable(i)));
					}
				}
				printer.print(");");
			}));
			printer.println_increasing(print_functor([&](auto& printer) {
				printer.print(format("static % f%(", return_type, print_number(index)));
				bool is_first_argument = true;
				for (std::size_t i = 0; i < arguments; ++i) {
					if (function->get_argument_types()[i] != TypeInterner::get_void_type()) {
						if (is_first_argument) is_first_argument = false;
						else printer.print(", ");
						const Type argument_type = function_table.get_type(function->get_argument_types()[i]);
						printer.print(format("% %", argument_type, Variable(i)));
					}
				}
				printer.print(") {");
			}));
			if (tail_call_data.has_tail_call(function)) {
				printer.println_increasing("while (1) {");
			}
			const Variable result = Variable(arguments);
			if (function->get_return_type()->get_id() != TypeId::VOID) {
				const Type result_type = function_table.get_type(function->get_return_type());
				printer.println(format("% %;", result_type, result));
			}
			CodegenC::evaluate(function_table, printer, arguments + 1, result, tail_call_data, function->get_block());
			if (function->get_return_type()->get_id() != TypeId::VOID) {
				printer.println(format("return %;", result));
			}
			else {
				printer.println("return;");
			}
			if (tail_call_data.has_tail_call(function)) {
				printer.println_decreasing("}");
			}
			printer.println_decreasing("}");
		}
		std::string c_path = std::string(source_path) + ".c";
		{
			std::ofstream file(c_path);
			file << type_declarations.str();
			file << function_declarations.str();
			file << type_functions.str();
			file << functions.str();
		}
		Printer status_printer(std::cerr);
		status_printer.print(bold(c_path));
		status_printer.print(bold(green(" successfully generated")));
		status_printer.print('\n');
		std::string executable_path = std::string(source_path) + ".exe";
		const char* c_compiler = getenv("CC", "cc");
		const char* compiler_arguments = getenv("CFLAGS", "");
		std::string command = std::string(c_compiler) + " " + compiler_arguments + " -o " + executable_path + " " + c_path;
		if (std::system(command.c_str()) == 0) {
			status_printer.print(bold(executable_path));
			status_printer.print(bold(green(" successfully generated")));
			status_printer.print('\n');
		}
	}